

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O3

BackTraceSymbol __thiscall
cppassert::internal::BackTraceSymbol::createFromBacktraceStr
          (BackTraceSymbol *this,char *backTraceSymbol,CppDemangler *demangler)

{
  char cVar1;
  char *position;
  char *pcVar2;
  CppDemangler *extraout_RDX;
  CppDemangler *extraout_RDX_00;
  CppDemangler *extraout_RDX_01;
  char *beginName;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  BackTraceSymbol BVar7;
  
  this->symbol_ = "<unkown>";
  this->allocated_ = (char *)0x0;
  pcVar2 = backTraceSymbol;
  pcVar3 = (char *)0x0;
  pcVar5 = (char *)0x0;
  do {
    cVar1 = *pcVar2;
    pcVar4 = pcVar2;
    pcVar6 = pcVar5;
    if ((cVar1 != '(') && (pcVar4 = pcVar3, pcVar6 = pcVar2, cVar1 != '+')) {
      if (cVar1 == '\0') goto LAB_0010565a;
      pcVar6 = pcVar5;
      if (cVar1 == ')' && pcVar5 != (char *)0x0) break;
    }
    pcVar2 = pcVar2 + 1;
    pcVar3 = pcVar4;
    pcVar5 = pcVar6;
  } while( true );
  if (pcVar3 < pcVar5 && pcVar3 != (char *)0x0) {
    *pcVar3 = '\0';
    *pcVar5 = '\0';
    pcVar2 = CppDemangler::demangle(demangler,pcVar3 + 1);
    if (pcVar2 != (char *)0x0) {
      setSymbol(this,backTraceSymbol,pcVar2,pcVar5 + 1);
      demangler = extraout_RDX_00;
      goto LAB_0010565d;
    }
    *pcVar3 = '(';
    *pcVar5 = '+';
    demangler = extraout_RDX;
    if (this->allocated_ != (char *)0x0) {
      free(this->allocated_);
      this->allocated_ = (char *)0x0;
      demangler = extraout_RDX_01;
    }
  }
LAB_0010565a:
  this->symbol_ = backTraceSymbol;
LAB_0010565d:
  BVar7.allocated_ = (char *)demangler;
  BVar7.symbol_ = (char *)this;
  return BVar7;
}

Assistant:

static BackTraceSymbol createFromBacktraceStr(char *backTraceSymbol
                                        , CppDemangler *demangler)
    {
        BackTraceSymbol result;
        char *beginName = 0, *beginOffset = 0, *endOffset = 0;
        findSymbolInBacktraceStr(backTraceSymbol
                                , &beginName
                                , &beginOffset
                                , &endOffset);

        if (beginName
            && beginOffset
            && endOffset
	    && beginName < beginOffset)
	{
	    *beginName++ = '\0';
            *beginOffset++ = '\0';
            const char *demangledSymbol = demangler->demangle(beginName);
            if(demangledSymbol)
            {
                result.setSymbol(backTraceSymbol, demangledSymbol, beginOffset);
            }
            else
            {
                //restore previous state
                --beginName;
                --beginOffset;
                *beginName = '(';
                *beginOffset = '+';
                result.setSymbol(backTraceSymbol);
            }
        }
        else
        {
            result.setSymbol(backTraceSymbol);
        }

        return result;
    }